

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

BOOL __thiscall
Js::ScriptContext::IsNumericPropertyId(ScriptContext *this,PropertyId propertyId,uint32 *value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t cVar4;
  char16 *pcVar5;
  size_t sVar6;
  undefined4 *puVar7;
  uint32 local_3c;
  BOOL isIndex;
  uint32 index;
  PropertyRecord *name;
  uint32 *puStack_28;
  BOOL isNumericPropertyId;
  uint32 *value_local;
  ScriptContext *pSStack_18;
  PropertyId propertyId_local;
  ScriptContext *this_local;
  
  puStack_28 = value;
  value_local._4_4_ = propertyId;
  pSStack_18 = this;
  name._4_4_ = ThreadContext::IsNumericPropertyId(this->threadContext,propertyId,value);
  _isIndex = GetPropertyName(this,value_local._4_4_);
  if (_isIndex != (PropertyRecord *)0x0) {
    bVar2 = PropertyRecord::IsSymbol(_isIndex);
    if (bVar2) {
      return 0;
    }
    pcVar5 = PropertyRecord::GetBuffer(_isIndex);
    BVar3 = Js::JavascriptArray::GetIndex(pcVar5,&local_3c);
    if (name._4_4_ == BVar3) {
      if ((name._4_4_ != 0) && (*puStack_28 != local_3c)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x3b6,"((uint32)*value == index)","(uint32)*value == index");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
    else {
      cVar4 = PropertyRecord::GetLength(_isIndex);
      pcVar5 = PropertyRecord::GetBuffer(_isIndex);
      sVar6 = PAL_wcslen(pcVar5);
      if (cVar4 == sVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x3b2,
                                    "((size_t)(name->GetLength()) != PAL_wcslen(name->GetBuffer()))"
                                    ,"(size_t)(name->GetLength()) != wcslen(name->GetBuffer())");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  return name._4_4_;
}

Assistant:

BOOL ScriptContext::IsNumericPropertyId(PropertyId propertyId, uint32* value)
    {
        BOOL isNumericPropertyId = threadContext->IsNumericPropertyId(propertyId, value);

#if DEBUG
        PropertyRecord const * name = this->GetPropertyName(propertyId);

        if (name != nullptr)
        {
            // Symbol properties are not numeric - description should not be used.
            if (name->IsSymbol())
            {
                return false;
            }

            uint32 index;
            BOOL isIndex = JavascriptArray::GetIndex(name->GetBuffer(), &index);
            if (isNumericPropertyId != isIndex)
            {
                // WOOB 1137798: JavascriptArray::GetIndex does not handle embedded NULLs. So if we have a property
                // name "1234\0", JavascriptArray::GetIndex would incorrectly accepts it as an array index property
                // name.
                Assert((size_t)(name->GetLength()) != wcslen(name->GetBuffer()));
            }
            else if (isNumericPropertyId)
            {
                Assert((uint32)*value == index);
            }
        }
#endif

        return isNumericPropertyId;
    }